

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

basic_substring<char> __thiscall
c4::basic_substring<char>::triml(basic_substring<char> *this,ro_substr chars)

{
  code *pcVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  size_t extraout_RDX;
  size_t sVar5;
  basic_substring<char> bVar6;
  basic_substring<char> local_20;
  
  if ((this->len != 0) && (this->str != (char *)0x0)) {
    pcVar3 = (char *)first_not_of(this,chars,0);
    pcVar4 = pcVar3;
    sVar5 = extraout_RDX;
    if (pcVar3 != (char *)0xffffffffffffffff) {
      if ((char *)this->len < pcVar3) {
        if ((s_error_flags & 1) != 0) {
          bVar2 = is_debugger_attached();
          if (bVar2) {
            pcVar1 = (code *)swi(3);
            bVar6 = (basic_substring<char>)(*pcVar1)();
            return bVar6;
          }
        }
        handle_error(0x1fe047,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring(&local_20,pcVar3 + (long)this->str,this->len - (long)pcVar3);
      pcVar4 = local_20.str;
      sVar5 = local_20.len;
    }
    if (pcVar3 != (char *)0xffffffffffffffff) goto LAB_001ef53c;
  }
  pcVar4 = this->str;
  sVar5 = 0;
LAB_001ef53c:
  bVar6.len = sVar5;
  bVar6.str = pcVar4;
  return bVar6;
}

Assistant:

basic_substring triml(ro_substr chars) const
    {
        if( ! empty())
        {
            size_t pos = first_not_of(chars);
            if(pos != npos)
                return sub(pos);
        }
        return sub(0, 0);
    }